

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  FT_UInt FVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  PS_UniMap *pPVar6;
  uint uVar7;
  
  pPVar3 = table->maps;
  pPVar4 = pPVar3 + ((ulong)table->num_maps - 1);
  pPVar5 = (PS_UniMap *)0x0;
  while (pPVar3 <= pPVar4) {
    pPVar6 = pPVar3 + ((long)pPVar4 - (long)pPVar3 >> 4);
    if (pPVar6->unicode == unicode) goto LAB_00210473;
    uVar7 = pPVar6->unicode & 0x7fffffff;
    pPVar1 = pPVar6;
    if (uVar7 != unicode) {
      pPVar1 = pPVar5;
    }
    pPVar5 = pPVar1;
    if (pPVar3 == pPVar4) break;
    if (uVar7 < unicode) {
      pPVar3 = pPVar6 + 1;
    }
    else {
      pPVar4 = pPVar6 + -1;
    }
  }
  pPVar6 = pPVar5;
  if (pPVar5 == (PS_UniMap *)0x0) {
    FVar2 = 0;
  }
  else {
LAB_00210473:
    FVar2 = pPVar6->glyph_index;
  }
  return FVar2;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }